

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * bc_strndup(char *s,size_t n)

{
  size_t __n;
  char *__dest;
  
  if (s != (char *)0x0) {
    __n = strnlen(s,n);
    __dest = (char *)malloc(__n + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,s,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char*
bc_strndup(const char *s, size_t n)
{
    if (s == NULL)
        return NULL;
    size_t l = strnlen(s, n);
    char *tmp = malloc(l + 1);
    if (tmp == NULL)
        return NULL;
    memcpy(tmp, s, l);
    tmp[l] = '\0';
    return tmp;
}